

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

QString * preprocessMetadata(QString *__return_storage_ptr__,QString *in)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  QString *extraout_RDX;
  QString *extraout_RDX_00;
  QString *extraout_RDX_01;
  QString *pQVar5;
  QString *extraout_RDX_02;
  long lVar6;
  int i;
  undefined1 *puVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_b0;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  lVar6 = 0;
  QString::split((QStringList *)&local_58,in,(QChar)0x5c,(SplitBehavior)0x0,CaseSensitive);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  pQVar5 = extraout_RDX;
  for (puVar7 = (undefined1 *)0x0; puVar7 < (ulong)local_58.size; puVar7 = puVar7 + 1) {
    local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::simplified_helper
              ((QString *)&local_78,(QString *)((long)&((local_58.ptr)->d).d + lVar6),pQVar5);
    if ((undefined1 *)0x1 < (ulong)local_78.size) {
      local_b0.d = (Data *)0x0;
      local_b0.ptr = (char16_t *)0x0;
      local_98.d = (Data *)0x0;
      local_98.ptr = L"\"";
      local_b0.size = 0;
      local_98.size = 1;
      bVar4 = QString::startsWith((QString *)&local_78,(QString *)&local_98,CaseSensitive);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
      if (bVar4) {
        QString::right((QString *)&local_98,(QString *)&local_78,(qsizetype)(local_78.size + -1));
        qVar3 = local_78.size;
        pcVar2 = local_78.ptr;
        pDVar1 = local_78.d;
        local_78.d = local_98.d;
        local_78.ptr = local_98.ptr;
        local_98.d = pDVar1;
        local_98.ptr = pcVar2;
        local_78.size = local_98.size;
        local_98.size = qVar3;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      }
      local_b0.d = (Data *)0x0;
      local_b0.ptr = (char16_t *)0x0;
      local_98.d = (Data *)0x0;
      local_98.ptr = L"\"";
      local_b0.size = 0;
      local_98.size = 1;
      bVar4 = QString::endsWith((QString *)&local_78,(QString *)&local_98,CaseSensitive);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
      pQVar5 = extraout_RDX_00;
      if (bVar4) {
        QString::left((QString *)&local_98,(QString *)&local_78,(qsizetype)(local_78.size + -1));
        qVar3 = local_78.size;
        pcVar2 = local_78.ptr;
        pDVar1 = local_78.d;
        local_78.d = local_98.d;
        local_78.ptr = local_98.ptr;
        local_98.d = pDVar1;
        local_98.ptr = pcVar2;
        local_78.size = local_98.size;
        local_98.size = qVar3;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
        pQVar5 = extraout_RDX_01;
      }
      QString::simplified_helper((QString *)&local_98,(QString *)&local_78,pQVar5);
      qVar3 = local_78.size;
      pcVar2 = local_78.ptr;
      pDVar1 = local_78.d;
      local_78.d = local_98.d;
      local_78.ptr = local_98.ptr;
      local_98.d = pDVar1;
      local_98.ptr = pcVar2;
      local_78.size = local_98.size;
      local_98.size = qVar3;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      if ((undefined1 *)0x1 < (ulong)local_78.size) {
        if ((__return_storage_ptr__->d).size != 0) {
          QString::append(__return_storage_ptr__,(QChar)0xa);
        }
        QString::append(__return_storage_ptr__,(QString *)&local_78);
      }
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    lVar6 = lVar6 + 0x18;
    pQVar5 = extraout_RDX_02;
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QString preprocessMetadata(const QString &in)
{
    DEBUGPRINTF(printf("in: %s\n", qPrintable(in)));
    QList<QString> lines = in.split(QLatin1Char('\\'));
    QString out;
    for (int i = 0; i < lines.size(); i++) {
        QString l = lines.at(i).simplified();
        DEBUGPRINTF(printf("line: %s\n", qPrintable(l)));
        if (l.length() < 2)
            continue;
        if (l.startsWith(QStringLiteral("\"")))
            l = l.right(l.length() - 1);
        if (l.endsWith(QStringLiteral("\"")))
            l = l.left(l.length() - 1);
        l = l.simplified();

        if (l.length() > 1) {
            if (out.size() > 0)
                out.append(QLatin1Char('\n'));
            out.append(l);
        }
    }
    DEBUGPRINTF(printf("out: %s\n", qPrintable(out)));
    return out;
}